

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O1

ServicePublicationPtr __thiscall
miniros::ServiceManager::lookupServicePublication(ServiceManager *this,string *service)

{
  pthread_mutex_t *__mutex;
  void *__s2;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *__n;
  int iVar3;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *psVar4;
  ServicePublicationPtr SVar5;
  
  __mutex = (pthread_mutex_t *)((long)&service->field_2 + 8);
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  psVar4 = (string *)(service->_M_dataplus)._M_p;
  if (psVar4 != service) {
    __s2 = (void *)*in_RDX;
    p_Var1 = (_List_node_base *)in_RDX[1];
    do {
      p_Var2 = (_List_node_base *)(psVar4->field_2)._M_allocated_capacity;
      __n = *(_List_node_base **)((long)(p_Var2 + 1) + 8);
      if (__n == p_Var1) {
        if (__n != (_List_node_base *)0x0) {
          iVar3 = bcmp(p_Var2[1]._M_next,__s2,(size_t)__n);
          if (iVar3 != 0) goto LAB_0020004b;
        }
        (this->service_publications_).
        super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = p_Var2;
        p_Var1 = *(_List_node_base **)((long)&psVar4->field_2 + 8);
        (this->service_publications_).
        super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev = p_Var1;
        if (p_Var1 != (_List_node_base *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&p_Var1->_M_prev = *(int *)&p_Var1->_M_prev + 1;
            UNLOCK();
          }
          else {
            *(int *)&p_Var1->_M_prev = *(int *)&p_Var1->_M_prev + 1;
          }
        }
        goto LAB_0020005a;
      }
LAB_0020004b:
      psVar4 = (string *)(psVar4->_M_dataplus)._M_p;
    } while (psVar4 != service);
  }
  (this->service_publications_).
  super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->service_publications_).
  super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
LAB_0020005a:
  pthread_mutex_unlock(__mutex);
  SVar5.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  SVar5.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ServicePublicationPtr)
         SVar5.super___shared_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ServicePublicationPtr ServiceManager::lookupServicePublication(const std::string& service)
{
  std::scoped_lock<std::mutex> lock(service_publications_mutex_);

  for (const auto& pub: service_publications_)
  {
    if (pub->getName() == service)
      return pub;
  }

  return {};
}